

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall cppgenerate::Variable::Variable(Variable *this,Variable *other)

{
  Variable *other_local;
  Variable *this_local;
  
  this->_vptr_Variable = (_func_int **)&PTR__Variable_0014ad50;
  std::__cxx11::string::string((string *)&this->m_type);
  std::__cxx11::string::string((string *)&this->m_name);
  std::__cxx11::string::string((string *)&this->m_initializer);
  std::__cxx11::string::operator=((string *)&this->m_initializer,(string *)&other->m_initializer);
  std::__cxx11::string::operator=((string *)&this->m_type,(string *)&other->m_type);
  std::__cxx11::string::operator=((string *)&this->m_name,(string *)&other->m_name);
  return;
}

Assistant:

Variable::Variable( const Variable& other ){
    m_initializer = other.m_initializer;
    m_type = other.m_type;
    m_name = other.m_name;
}